

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test-tmpdir.c
# Opt level: O0

int run_test_tmpdir(void)

{
  int iVar1;
  size_t sVar2;
  int r;
  char last;
  size_t len;
  char tmpdir [1024];
  
  _r = 0x400;
  len._0_1_ = 0;
  sVar2 = strlen((char *)&len);
  if (sVar2 != 0) {
    fprintf(_stderr,"Assertion failed in %s on line %d: %s\n",
            "/workspace/llm4binary/github/license_all_cmakelists_25/revery-ui[P]esy-libuv/test/test-tmpdir.c"
            ,0x27,"strlen(tmpdir) == 0");
    abort();
  }
  iVar1 = uv_os_tmpdir(&len,&r);
  if (iVar1 != 0) {
    fprintf(_stderr,"Assertion failed in %s on line %d: %s\n",
            "/workspace/llm4binary/github/license_all_cmakelists_25/revery-ui[P]esy-libuv/test/test-tmpdir.c"
            ,0x29,"r == 0");
    abort();
  }
  sVar2 = strlen((char *)&len);
  if (sVar2 != _r) {
    fprintf(_stderr,"Assertion failed in %s on line %d: %s\n",
            "/workspace/llm4binary/github/license_all_cmakelists_25/revery-ui[P]esy-libuv/test/test-tmpdir.c"
            ,0x2a,"strlen(tmpdir) == len");
    abort();
  }
  if (_r == 0) {
    fprintf(_stderr,"Assertion failed in %s on line %d: %s\n",
            "/workspace/llm4binary/github/license_all_cmakelists_25/revery-ui[P]esy-libuv/test/test-tmpdir.c"
            ,0x2b,"len > 0");
    abort();
  }
  if (tmpdir[_r - 8] != '\0') {
    fprintf(_stderr,"Assertion failed in %s on line %d: %s\n",
            "/workspace/llm4binary/github/license_all_cmakelists_25/revery-ui[P]esy-libuv/test/test-tmpdir.c"
            ,0x2c,"tmpdir[len] == \'\\0\'");
    abort();
  }
  if ((1 < _r) && ((&last)[_r] == '/')) {
    fprintf(_stderr,"Assertion failed in %s on line %d: %s\n",
            "/workspace/llm4binary/github/license_all_cmakelists_25/revery-ui[P]esy-libuv/test/test-tmpdir.c"
            ,0x33,"last != \'/\'");
    abort();
  }
  _r = 1;
  iVar1 = uv_os_tmpdir(&len,&r);
  if (iVar1 != -0x69) {
    fprintf(_stderr,"Assertion failed in %s on line %d: %s\n",
            "/workspace/llm4binary/github/license_all_cmakelists_25/revery-ui[P]esy-libuv/test/test-tmpdir.c"
            ,0x3a,"r == UV_ENOBUFS");
    abort();
  }
  if (1 < _r) {
    iVar1 = uv_os_tmpdir(0,&r);
    if (iVar1 != -0x16) {
      fprintf(_stderr,"Assertion failed in %s on line %d: %s\n",
              "/workspace/llm4binary/github/license_all_cmakelists_25/revery-ui[P]esy-libuv/test/test-tmpdir.c"
              ,0x3f,"r == UV_EINVAL");
      abort();
    }
    iVar1 = uv_os_tmpdir(&len,0);
    if (iVar1 == -0x16) {
      _r = 0;
      iVar1 = uv_os_tmpdir(&len,&r);
      if (iVar1 == -0x16) {
        return 0;
      }
      fprintf(_stderr,"Assertion failed in %s on line %d: %s\n",
              "/workspace/llm4binary/github/license_all_cmakelists_25/revery-ui[P]esy-libuv/test/test-tmpdir.c"
              ,0x44,"r == UV_EINVAL");
      abort();
    }
    fprintf(_stderr,"Assertion failed in %s on line %d: %s\n",
            "/workspace/llm4binary/github/license_all_cmakelists_25/revery-ui[P]esy-libuv/test/test-tmpdir.c"
            ,0x41,"r == UV_EINVAL");
    abort();
  }
  fprintf(_stderr,"Assertion failed in %s on line %d: %s\n",
          "/workspace/llm4binary/github/license_all_cmakelists_25/revery-ui[P]esy-libuv/test/test-tmpdir.c"
          ,0x3b,"len > SMALLPATH");
  abort();
}

Assistant:

TEST_IMPL(tmpdir) {
  char tmpdir[PATHMAX];
  size_t len;
  char last;
  int r;

  /* Test the normal case */
  len = sizeof tmpdir;
  tmpdir[0] = '\0';

  ASSERT(strlen(tmpdir) == 0);
  r = uv_os_tmpdir(tmpdir, &len);
  ASSERT(r == 0);
  ASSERT(strlen(tmpdir) == len);
  ASSERT(len > 0);
  ASSERT(tmpdir[len] == '\0');

  if (len > 1) {
    last = tmpdir[len - 1];
#ifdef _WIN32
    ASSERT(last != '\\');
#else
    ASSERT(last != '/');
#endif
  }

  /* Test the case where the buffer is too small */
  len = SMALLPATH;
  r = uv_os_tmpdir(tmpdir, &len);
  ASSERT(r == UV_ENOBUFS);
  ASSERT(len > SMALLPATH);

  /* Test invalid inputs */
  r = uv_os_tmpdir(NULL, &len);
  ASSERT(r == UV_EINVAL);
  r = uv_os_tmpdir(tmpdir, NULL);
  ASSERT(r == UV_EINVAL);
  len = 0;
  r = uv_os_tmpdir(tmpdir, &len);
  ASSERT(r == UV_EINVAL);

#ifdef _WIN32
  const char *name = "TMP";
  char tmpdir_win[] = "C:\\xxxxxxxxxxxxxxxxxxxxxxxxxxxxxxxxxxxxxxxxxxxxxxxxxxxxxxxxxxxxxxxxxxxxxxxxxxxxxxxxxxxxxxxxxxxxxxxxxxxxxxxxxxxxxxxxxxxxxxxxxxxxxxxxxxxxxxxxxxxxxxxxxxxxxxxxxxxxxxxxxxxxxxxxxxxxxxxxxxxxxxxxxxxxxxxxxxxxxxxxxxxxxxxxxxxxxxxxxxxxxxxxxxxxxxxxxxxxxxxxxxxxxxxxxxxxxxxxx";
  r = uv_os_setenv(name, tmpdir_win);
  ASSERT(r == 0);
  char tmpdirx[PATHMAX];
  size_t lenx = sizeof tmpdirx;
  r = uv_os_tmpdir(tmpdirx, &lenx);
  ASSERT(r == 0);
#endif

  return 0;
}